

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  aiColor4t<float> *paVar2;
  float *out;
  float *out_00;
  vector<char,_std::allocator<char>_> *pvVar3;
  char cVar4;
  _func_int **pp_Var5;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar6;
  pointer *ppaVar7;
  float fVar8;
  float fVar9;
  aiMaterial *paVar10;
  IOStream *pIVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_var;
  IrrXMLReader *pIVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Logger *pLVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  aiMesh *paVar18;
  undefined4 extraout_var_04;
  ulong *puVar19;
  aiFace *paVar20;
  aiVector3D *paVar21;
  aiColor4D *paVar22;
  undefined4 extraout_var_05;
  uint *puVar23;
  char *pcVar24;
  aiMesh **ppaVar25;
  aiMaterial **__dest;
  aiNode *this_00;
  runtime_error *prVar26;
  long *plVar27;
  byte bVar28;
  aiFace *paVar29;
  long *plVar30;
  aiVector3D *paVar31;
  ulong uVar32;
  pointer __src;
  size_type __n;
  byte *c;
  aiVector3D *paVar33;
  pointer paVar34;
  aiVector3D *paVar35;
  aiVector3D *paVar36;
  uint uVar37;
  pointer ppaVar38;
  int iVar39;
  long lVar40;
  IrrlichtBase *this_01;
  float fVar41;
  undefined1 auVar42 [16];
  aiMaterial *curMat;
  uint curMatFlags;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  int idx;
  CIrrXML_IOStreamReader st;
  aiMaterial *local_218;
  aiVector3t<float> local_210;
  aiMesh *local_200;
  aiMesh *local_1f8;
  uint local_1ec;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1e8;
  uint local_1d0;
  uint local_1cc;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_1c8;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_1a8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_188;
  IOStream *local_170;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_168;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_148;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_128;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_108;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong local_a0;
  aiVector3D *local_98;
  aiColor4D *local_90;
  aiVector3D *local_88;
  aiVector3D *local_80;
  aiMesh *local_78;
  CIrrXML_IOStreamReader local_70;
  aiVector3D *local_40;
  aiVector3D *local_38;
  
  pvVar3 = &local_70.data;
  local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar12 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,
                      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack);
  local_170 = (IOStream *)CONCAT44(extraout_var,iVar12);
  if ((vector<char,_std::allocator<char>_> *)
      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack != pvVar3) {
    operator_delete(local_70.super_IFileReadCallBack._vptr_IFileReadCallBack);
  }
  if (local_170 == (IOStream *)0x0) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,"Failed to open IRRMESH file ",pFile);
    plVar27 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)*plVar27;
    plVar30 = plVar27 + 2;
    if (local_70.super_IFileReadCallBack._vptr_IFileReadCallBack == (_func_int **)plVar30) {
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar27[3];
      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar3;
    }
    else {
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
    }
    local_70.stream = (IOStream *)plVar27[1];
    *plVar27 = (long)plVar30;
    plVar27[1] = 0;
    *(undefined1 *)(plVar27 + 2) = 0;
    std::runtime_error::runtime_error(prVar26,(string *)&local_70);
    *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(&local_70,local_170);
  pIVar16 = irr::io::createIrrXMLReader(&local_70.super_IFileReadCallBack);
  (this->super_IrrlichtBase).reader = pIVar16;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterial **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(&local_1c8,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_188,5);
  this_01 = &this->super_IrrlichtBase;
  local_218 = (aiMaterial *)0x0;
  local_200 = (aiMesh *)0x0;
  local_1ec = 0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_a0 = 0;
  iVar12 = 0;
LAB_00421bbf:
  iVar39 = 0;
  iVar13 = iVar12;
LAB_00421bc2:
  do {
    iVar12 = iVar13;
LAB_00421bc7:
    iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar13 == '\0') {
      if (local_218 != (aiMaterial *)0x0 || local_200 != (aiMesh *)0x0) {
        if (local_218 == (aiMaterial *)0x0 || local_200 == (aiMesh *)0x0) {
          pLVar17 = DefaultLogger::get();
          Logger::error(pLVar17,"IRRMESH: A buffer must contain a mesh and a material");
          paVar10 = local_218;
          if (local_218 != (aiMaterial *)0x0) {
            aiMaterial::~aiMaterial(local_218);
            operator_delete(paVar10);
            local_218 = (aiMaterial *)0x0;
          }
          paVar18 = local_200;
          if (local_200 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(local_200);
            operator_delete(paVar18);
            local_200 = (aiMesh *)0x0;
          }
        }
        else {
          if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                       (iterator)
                       local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_218);
          }
          else {
            *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_218;
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                       (iterator)
                       local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_200);
          }
          else {
            *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_200;
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      ppaVar38 = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)((long)&local_c8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"IRRMESH: Unable to read a mesh from this file","");
        std::runtime_error::runtime_error(prVar26,(string *)&local_c8);
        *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar15 = (uint)((ulong)((long)local_188.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      pScene->mNumMeshes = uVar15;
      ppaVar25 = (aiMesh **)
                 operator_new__((long)local_188.
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_188.
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
      pScene->mMeshes = ppaVar25;
      if (uVar15 != 0) {
        uVar32 = 0;
        do {
          pScene->mMeshes[uVar32] =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar32];
          pScene->mMeshes[uVar32]->mNumUVComponents[3] = 0;
          uVar32 = uVar32 + 1;
          __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
          ppaVar38 = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar32 < pScene->mNumMeshes);
      }
      pScene->mNumMaterials = (uint)((ulong)((long)ppaVar38 - (long)__src) >> 3);
      uVar32 = (long)ppaVar38 - (long)__src & 0x7fffffff8;
      __dest = (aiMaterial **)operator_new__(uVar32);
      pScene->mMaterials = __dest;
      memcpy(__dest,__src,uVar32);
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode = this_00;
      (this_00->mName).length = 9;
      builtin_strncpy((this_00->mName).data,"<IRRMesh>",10);
      uVar15 = pScene->mNumMeshes;
      this_00->mNumMeshes = uVar15;
      puVar23 = (uint *)operator_new__((ulong)uVar15 << 2);
      pIVar11 = local_170;
      this_00->mMeshes = puVar23;
      if (uVar15 != 0) {
        uVar32 = 0;
        do {
          pScene->mRootNode->mMeshes[uVar32] = (uint)uVar32;
          uVar32 = uVar32 + 1;
        } while (uVar32 < pScene->mNumMeshes);
      }
      if (this_01->reader != (IrrXMLReader *)0x0) {
        (*this_01->reader->_vptr_IIrrXMLReader[1])();
      }
      this_01->reader = (IrrXMLReader *)0x0;
      if (local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_168.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_148.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start != (aiColor4t<float> *)0x0) {
        operator_delete(local_1a8.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_128.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_108.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start != (aiMaterial **)0x0) {
        operator_delete(local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack =
           (_func_int **)&PTR__CIrrXML_IOStreamReader_00876da8;
      if (local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      (*pIVar11->_vptr_IOStream[1])(pIVar11);
      return;
    }
    iVar14 = (*this_01->reader->_vptr_IIrrXMLReader[3])();
    iVar13 = iVar12;
    if (iVar14 != 1) {
      if (iVar14 != 3) goto LAB_00421bc2;
      iVar14 = (*this_01->reader->_vptr_IIrrXMLReader[0xe])();
      c = (byte *)CONCAT44(extraout_var_04,iVar14);
      if (iVar39 != 2) {
        if (iVar39 != 1) goto LAB_00421bc2;
        goto LAB_0042291b;
      }
      local_1f8 = (aiMesh *)local_200->mFaces;
      local_78 = (aiMesh *)(local_1f8->mColors + (ulong)local_200->mNumFaces * 2 + -6);
      local_80 = local_200->mVertices;
      paVar21 = local_200->mNormals;
      paVar35 = local_200->mTangents;
      paVar33 = local_200->mBitangents;
      paVar22 = local_200->mColors[0];
      paVar36 = local_200->mTextureCoords[0];
      paVar31 = local_200->mTextureCoords[1];
      uVar15 = 0;
      local_1cc = 0;
      break;
    }
    iVar14 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_00,iVar14) == (char *)0x0) {
LAB_004231b2:
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                    ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar14 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar14),"buffer");
    if ((iVar14 == 0) && (local_218 != (aiMaterial *)0x0 || local_200 != (aiMesh *)0x0)) {
      if (local_218 == (aiMaterial *)0x0 || local_200 == (aiMesh *)0x0) {
        pLVar17 = DefaultLogger::get();
        Logger::error(pLVar17,"IRRMESH: A buffer must contain a mesh and a material");
        paVar10 = local_218;
        if (local_218 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_218);
          operator_delete(paVar10);
          local_218 = (aiMaterial *)0x0;
        }
        paVar18 = local_200;
        if (local_200 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(local_200);
          operator_delete(paVar18);
        }
      }
      else {
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_218);
        }
        else {
          *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_218;
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_200);
        }
        else {
          *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_200;
          local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_218 = (aiMaterial *)0x0;
      local_200 = (aiMesh *)0x0;
      if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
    iVar14 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_01,iVar14) == (char *)0x0) goto LAB_004231b2;
    iVar14 = strcasecmp((char *)CONCAT44(extraout_var_01,iVar14),"material");
    if (iVar14 == 0) {
      if (local_218 != (aiMaterial *)0x0) {
        pLVar17 = DefaultLogger::get();
        Logger::warn(pLVar17,"IRRMESH: Only one material description per buffer, please");
        paVar10 = local_218;
        if (local_218 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_218);
          operator_delete(paVar10);
          local_218 = (aiMaterial *)0x0;
        }
      }
      local_218 = IrrlichtBase::ParseMaterial(this_01,&local_1ec);
    }
    iVar14 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_02,iVar14) == (char *)0x0) goto LAB_004231b2;
    iVar14 = strcasecmp((char *)CONCAT44(extraout_var_02,iVar14),"vertices");
    pp_Var5 = this_01->reader->_vptr_IIrrXMLReader;
    if (iVar14 == 0) {
      iVar13 = (*pp_Var5[9])(this_01->reader,"vertexCount");
      if (iVar13 != 0) {
        __n = (size_type)iVar13;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_1e8,__n)
        ;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_e8,__n);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&local_1a8,__n);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_148,__n)
        ;
        iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[8])(this_01->reader,"type");
        pcVar24 = (char *)CONCAT44(extraout_var_05,iVar13);
        if (pcVar24 == (char *)0x0) {
          __assert_fail("__null != s2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                        ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        iVar13 = strcasecmp("2tcoords",pcVar24);
        if (iVar13 == 0) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    (&local_168,__n);
          iVar39 = 1;
          iVar13 = 1;
          if ((local_1ec >> 0x14 & 1) != 0) {
            local_c8._M_dataplus._M_p._0_4_ = 1.4013e-45;
            uVar37 = 0;
            uVar15 = 10;
            if (((local_1ec & 2) == 0) && (uVar15 = 6, (local_1ec >> 8 & 1) == 0)) {
              uVar15 = 1;
              uVar37 = 1;
              if ((local_1ec >> 0x10 & 1) != 0) goto LAB_0042282b;
            }
            else {
LAB_0042282b:
              aiMaterial::AddBinaryProperty
                        (local_218,&local_c8,4,"$tex.uvwsrc",uVar15,uVar37,aiPTI_Integer);
            }
            iVar39 = 1;
          }
        }
        else {
          iVar13 = strcasecmp("tangents",pcVar24);
          if (iVar13 == 0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_108,__n);
            iVar39 = 1;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_128,__n);
            iVar13 = 2;
          }
          else {
            iVar14 = strcasecmp("standard",pcVar24);
            paVar10 = local_218;
            iVar39 = 1;
            iVar13 = 0;
            if (iVar14 != 0) {
              if (local_218 != (aiMaterial *)0x0) {
                aiMaterial::~aiMaterial(local_218);
                operator_delete(paVar10);
                local_218 = (aiMaterial *)0x0;
              }
              pLVar17 = DefaultLogger::get();
              Logger::warn(pLVar17,"IRRMESH: Unknown vertex format");
              iVar13 = iVar12;
            }
          }
        }
        goto LAB_00421bc2;
      }
      pLVar17 = DefaultLogger::get();
      Logger::warn(pLVar17,"IRRMESH: Found mesh with zero vertices");
      paVar10 = local_218;
      if (local_218 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(local_218);
        operator_delete(paVar10);
        local_218 = (aiMaterial *)0x0;
      }
      paVar18 = local_200;
      iVar39 = 0;
      if (local_200 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(local_200);
        operator_delete(paVar18);
        local_200 = (aiMesh *)0x0;
        iVar39 = 0;
      }
      goto LAB_00421bc7;
    }
    iVar14 = (*pp_Var5[0xd])();
    if ((char *)CONCAT44(extraout_var_03,iVar14) == (char *)0x0) goto LAB_004231b2;
    iVar14 = strcasecmp((char *)CONCAT44(extraout_var_03,iVar14),"indices");
    if (iVar14 != 0) goto LAB_00421bc2;
    if ((local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (local_218 != (aiMaterial *)0x0)) {
      releaseMaterial(&local_218);
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c8._M_dataplus._M_p = (pointer)((long)&local_c8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"IRRMESH: indices must come after vertices","");
      std::runtime_error::runtime_error(prVar26,(string *)&local_c8);
      *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar18 = (aiMesh *)operator_new(0x520);
    paVar18->mPrimitiveTypes = 0;
    paVar18->mNumVertices = 0;
    paVar18->mNumFaces = 0;
    memset(&paVar18->mVertices,0,0xcc);
    paVar18->mBones = (aiBone **)0x0;
    paVar18->mMaterialIndex = 0;
    (paVar18->mName).length = 0;
    (paVar18->mName).data[0] = '\0';
    memset((paVar18->mName).data + 1,0x1b,0x3ff);
    paVar18->mNumAnimMeshes = 0;
    paVar18->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar18->mMethod = 0;
    (paVar18->mAABB).mMin.x = 0.0;
    (paVar18->mAABB).mMin.y = 0.0;
    (paVar18->mAABB).mMin.z = 0.0;
    (paVar18->mAABB).mMax.x = 0.0;
    (paVar18->mAABB).mMax.y = 0.0;
    (paVar18->mAABB).mMax.z = 0.0;
    memset(paVar18->mColors,0,0xa0);
    local_200 = paVar18;
    uVar15 = (*this_01->reader->_vptr_IIrrXMLReader[9])();
    local_200->mNumVertices = uVar15;
    uVar15 = local_200->mNumVertices;
    if (uVar15 == 0) {
      pLVar17 = DefaultLogger::get();
      Logger::warn(pLVar17,"IRRMESH: Found mesh with zero indices");
      paVar18 = local_200;
      if (local_200 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(local_200);
        operator_delete(paVar18);
        local_200 = (aiMesh *)0x0;
      }
      paVar10 = local_218;
      iVar39 = 0;
      if (local_218 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(local_218);
        operator_delete(paVar10);
        local_218 = (aiMaterial *)0x0;
      }
      goto LAB_00421bc7;
    }
    if (0x55555555 < uVar15 * -0x55555555) {
      pLVar17 = DefaultLogger::get();
      Logger::warn(pLVar17,"IRRMESH: Number if indices isn\'t divisible by 3");
      uVar15 = local_200->mNumVertices;
    }
    paVar18 = local_200;
    uVar32 = (ulong)uVar15 / 3;
    local_200->mNumFaces = uVar15 / 3;
    puVar19 = (ulong *)operator_new__(uVar32 * 0x10 + 8);
    *puVar19 = uVar32;
    paVar20 = (aiFace *)(puVar19 + 1);
    if (2 < uVar15) {
      paVar29 = paVar20;
      do {
        paVar29->mNumIndices = 0;
        paVar29->mIndices = (uint *)0x0;
        paVar29 = paVar29 + 1;
      } while (paVar29 != paVar20 + uVar32);
    }
    paVar18->mFaces = paVar20;
    paVar18->mMaterialIndex =
         (uint)((ulong)((long)local_1c8.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8.
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
    paVar18->mPrimitiveTypes = 4;
    local_1f8 = local_200;
    uVar15 = local_200->mNumVertices;
    uVar32 = (ulong)uVar15 * 0xc;
    paVar21 = (aiVector3D *)operator_new__(uVar32);
    if (uVar15 != 0) {
      memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
    }
    local_1f8->mVertices = paVar21;
    lVar40 = (long)local_1e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if ((long)local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 * 0xc;
      paVar21 = (aiVector3D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_1f8->mNormals = paVar21;
    }
    if ((long)local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 * 0xc;
      paVar21 = (aiVector3D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_1f8->mTangents = paVar21;
    }
    if ((long)local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 * 0xc;
      paVar21 = (aiVector3D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_1f8->mBitangents = paVar21;
    }
    if (((long)local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4 == (lVar40 >> 2) * -0x5555555555555555)
       && ((local_a0 & 1) != 0)) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 << 4;
      paVar22 = (aiColor4D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar22,0,uVar32);
      }
      local_1f8->mColors[0] = paVar22;
    }
    if ((long)local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 * 0xc;
      paVar21 = (aiVector3D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_1f8->mTextureCoords[0] = paVar21;
    }
    iVar39 = 2;
    if ((long)local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar15 = local_1f8->mNumVertices;
      uVar32 = (ulong)uVar15 * 0xc;
      paVar21 = (aiVector3D *)operator_new__(uVar32);
      if (uVar15 != 0) {
        memset(paVar21,0,((uVar32 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_1f8->mTextureCoords[1] = paVar21;
    }
  } while( true );
LAB_00422560:
  paVar18 = local_1f8;
  uVar32 = (ulong)*c;
  if (uVar32 < 0x21) {
    if ((0x100002600U >> (uVar32 & 0x3f) & 1) == 0) {
      if (uVar32 != 0) goto LAB_00422588;
      goto LAB_0042289b;
    }
    c = c + 1;
    goto LAB_00422560;
  }
LAB_00422588:
  if (local_1f8 < local_78) {
    local_1d0 = uVar15;
    local_98 = paVar36;
    local_90 = paVar22;
    local_88 = paVar33;
    local_40 = paVar31;
    local_38 = paVar35;
    if (uVar15 == 0) {
      local_1f8->mPrimitiveTypes = 3;
      puVar23 = (uint *)operator_new__(0xc);
      *(uint **)&paVar18->mNumFaces = puVar23;
      uVar32 = (ulong)*c;
    }
    uVar15 = 0;
    if (0xf5 < (byte)((char)uVar32 - 0x3aU)) {
      uVar15 = 0;
      do {
        uVar15 = (uint)(byte)((char)uVar32 - 0x30) + uVar15 * 10;
        pbVar1 = c + 1;
        uVar32 = (ulong)*pbVar1;
        c = c + 1;
      } while (0xf5 < (byte)(*pbVar1 - 0x3a));
    }
    uVar32 = ((long)local_1e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar32 < uVar15 || uVar32 - uVar15 == 0) {
      pLVar17 = DefaultLogger::get();
      uVar15 = 0;
      Logger::error(pLVar17,"IRRMESH: Index out of range");
    }
    (*(uint **)&local_1f8->mNumFaces)[local_1d0] = local_1cc;
    local_80->z = local_1e8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar15].z;
    fVar41 = local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar15].y;
    local_80->x = local_1e8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar15].x;
    local_80->y = fVar41;
    if (paVar21 == (aiVector3D *)0x0) {
      paVar21 = (aiVector3D *)0x0;
    }
    else {
      paVar21->z = local_e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].z;
      fVar41 = local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].y;
      paVar21->x = local_e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15].x;
      paVar21->y = fVar41;
      paVar21 = paVar21 + 1;
    }
    if (local_38 == (aiVector3D *)0x0) {
      paVar35 = (aiVector3D *)0x0;
    }
    else {
      local_38->z = local_108.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].z;
      fVar41 = local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].y;
      local_38->x = local_108.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].x;
      local_38->y = fVar41;
      paVar35 = local_38 + 1;
    }
    if (local_88 == (aiVector3D *)0x0) {
      paVar33 = (aiVector3D *)0x0;
    }
    else {
      local_88->z = local_128.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].z;
      fVar41 = local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].y;
      local_88->x = local_128.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].x;
      local_88->y = fVar41;
      paVar33 = local_88 + 1;
    }
    if (local_90 == (aiColor4D *)0x0) {
      paVar22 = (aiColor4D *)0x0;
    }
    else {
      paVar2 = local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar15;
      fVar41 = paVar2->g;
      fVar8 = paVar2->b;
      fVar9 = paVar2->a;
      local_90->r = paVar2->r;
      local_90->g = fVar41;
      local_90->b = fVar8;
      local_90->a = fVar9;
      paVar22 = local_90 + 1;
    }
    if (local_98 == (aiVector3D *)0x0) {
      paVar36 = (aiVector3D *)0x0;
    }
    else {
      local_98->z = local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].z;
      fVar41 = local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].y;
      local_98->x = local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].x;
      local_98->y = fVar41;
      paVar36 = local_98 + 1;
    }
    if (local_40 == (aiVector3D *)0x0) {
      paVar31 = (aiVector3D *)0x0;
    }
    else {
      local_40->z = local_168.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].z;
      fVar41 = local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].y;
      local_40->x = local_168.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar15].x;
      local_40->y = fVar41;
      paVar31 = local_40 + 1;
    }
    local_1cc = local_1cc + 1;
    local_80 = local_80 + 1;
    uVar37 = local_1d0 + 1;
    uVar15 = uVar37;
    if (uVar37 == 3) {
      uVar15 = 0;
    }
    local_1f8 = (aiMesh *)(local_1f8->mColors + (ulong)(uVar37 == 3) * 2 + -6);
    goto LAB_00422560;
  }
  pLVar17 = DefaultLogger::get();
  Logger::error(pLVar17,"IRRMESH: Too many indices");
LAB_0042289b:
  if (local_1f8 != local_78) {
    pLVar17 = DefaultLogger::get();
    Logger::error(pLVar17,"IRRMESH: Not enough indices");
  }
  iVar39 = 0;
  if (((local_1ec & 1) != 0) && ((local_a0 & 1) == 0)) {
    iVar39 = 0;
    aiMaterial::AddBinaryProperty
              (local_218,
               &(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->a,4,"$mat.opacity",0,0,aiPTI_Float);
  }
  goto LAB_00421bc2;
LAB_0042291b:
  out = &local_210.y;
  out_00 = &local_210.z;
  while (((ulong)*c < 0x21 && ((0x100002600U >> ((ulong)*c & 0x3f) & 1) != 0))) {
    c = c + 1;
  }
  local_210.x = 0.0;
  local_210.y = 0.0;
  local_210.z = 0.0;
  local_c8._0_16_ = ZEXT816(0);
  for (pcVar24 = fast_atoreal_move<float>((char *)c,&local_210.x,true);
      (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,out,true); (*pcVar24 == ' ' || (*pcVar24 == '\t'))
      ; pcVar24 = pcVar24 + 1) {
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,out_00,true);
      (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_1e8,
               (iterator)
               local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_210);
  }
  else {
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = local_210.z;
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_210.x;
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = local_210.y;
    local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,&local_210.x,true);
      (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,out,true); (*pcVar24 == ' ' || (*pcVar24 == '\t'))
      ; pcVar24 = pcVar24 + 1) {
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,out_00,true);
      (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_210);
  }
  else {
    (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = local_210.z;
    (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_210.x;
    (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = local_210.y;
    local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
  }
  uVar15 = 0;
  do {
    cVar4 = *pcVar24;
    if ((byte)(cVar4 - 0x30U) < 10) {
      uVar15 = uVar15 << 4 | (uint)(byte)(cVar4 - 0x30U);
    }
    else {
      bVar28 = cVar4 + 0xbf;
      if ((5 < bVar28) && (bVar28 = cVar4 + 0x9f, 5 < bVar28)) break;
      uVar15 = uVar15 * 0x10 + (uint)bVar28 + 10;
    }
    pcVar24 = pcVar24 + 1;
  } while( true );
  auVar42._0_4_ = (float)(uVar15 >> 0x10 & 0xff);
  auVar42._4_4_ = (float)(uVar15 >> 8 & 0xff);
  auVar42._8_4_ = (float)(uVar15 & 0xff);
  auVar42._12_4_ = (float)(uVar15 >> 0x18);
  local_c8._0_16_ = divps(auVar42,_DAT_006ef1d0);
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((local_c8._M_dataplus._M_p._0_4_ ==
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].r) &&
       (!NAN(local_c8._M_dataplus._M_p._0_4_) &&
        !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].r))) {
      if ((local_c8._M_dataplus._M_p._4_4_ ==
           local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].g) &&
         (!NAN(local_c8._M_dataplus._M_p._4_4_) &&
          !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].g))) {
        if (((float)local_c8._M_string_length ==
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].b) &&
           (!NAN((float)local_c8._M_string_length) &&
            !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].b))) {
          if ((local_c8._M_string_length._4_4_ ==
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].a) &&
             (!NAN(local_c8._M_string_length._4_4_) &&
              !NAN(local_1a8.
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].a))) goto LAB_00422b7d;
        }
      }
    }
    local_a0 = CONCAT71((uint7)(ushort)(uVar15 >> 0x10),1);
  }
LAB_00422b7d:
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
    _M_realloc_insert<aiColor4t<float>const&>
              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_1a8,
               (iterator)
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,(aiColor4t<float> *)&local_c8);
  }
  else {
    *(pointer *)
     local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish = local_c8._M_dataplus._M_p;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->b = (float)(undefined4)local_c8._M_string_length;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->a = (float)local_c8._M_string_length._4_4_;
    local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  for (; (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  for (pcVar24 = fast_atoreal_move<float>(pcVar24,&local_210.x,true);
      (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
  }
  for (c = (byte *)fast_atoreal_move<float>(pcVar24,out,true); (*c == 0x20 || (*c == 9)); c = c + 1)
  {
  }
  local_210.z = 0.0;
  fVar41 = 1.0 - local_210.y;
  local_210.y = fVar41;
  if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_148,
               (iterator)
               local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_210);
  }
  else {
    (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = 0.0;
    (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_210.x;
    (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = fVar41;
    local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (iVar12 == 1) {
    for (pcVar24 = fast_atoreal_move<float>((char *)c,&local_210.x,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    c = (byte *)fast_atoreal_move<float>(pcVar24,out,true);
    local_210.y = 1.0 - local_210.y;
    if (local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_168,
                 (iterator)
                 local_168.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_210);
      goto LAB_00422e7e;
    }
    pvVar6 = &local_168;
    paVar34 = local_168.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (iVar12 != 2) goto LAB_00422e7e;
    for (pcVar24 = fast_atoreal_move<float>((char *)c,&local_210.x,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    for (pcVar24 = fast_atoreal_move<float>(pcVar24,out_00,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    for (pcVar24 = fast_atoreal_move<float>(pcVar24,out,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    local_210._0_8_ = local_210._0_8_ ^ 0x8000000000000000;
    if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_108,
                 (iterator)
                 local_108.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_210);
    }
    else {
      (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->z = local_210.z;
      (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->x = local_210.x;
      (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->y = local_210.y;
      local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    for (pcVar24 = fast_atoreal_move<float>(pcVar24,&local_210.x,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    for (pcVar24 = fast_atoreal_move<float>(pcVar24,out_00,true);
        (*pcVar24 == ' ' || (*pcVar24 == '\t')); pcVar24 = pcVar24 + 1) {
    }
    for (c = (byte *)fast_atoreal_move<float>(pcVar24,out,true); (*c == 0x20 || (*c == 9));
        c = c + 1) {
    }
    local_210._0_8_ = local_210._0_8_ ^ 0x8000000000000000;
    if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_128,
                 (iterator)
                 local_128.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_210);
      goto LAB_00422e7e;
    }
    pvVar6 = &local_128;
    paVar34 = local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppaVar7 = &(pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  paVar34->z = local_210.z;
  paVar34->x = local_210.x;
  paVar34->y = local_210.y;
  *ppaVar7 = *ppaVar7 + 1;
LAB_00422e7e:
  while( true ) {
    bVar28 = *c;
    if ((bVar28 < 0xe) && ((0x2401U >> (bVar28 & 0x1f) & 1) != 0)) break;
    c = c + 1;
  }
  while ((bVar28 == 10 || (bVar28 == 0xd))) {
    pbVar1 = c + 1;
    c = c + 1;
    bVar28 = *pbVar1;
  }
  if (bVar28 == 0) goto LAB_00421bbf;
  goto LAB_0042291b;
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}